

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLEScanConstant<unsigned_char>
               (RLEScanState<unsigned_char> *scan_state,rle_count_t *index_pointer,
               uchar *data_pointer,idx_t scan_count,Vector *result)

{
  bool bVar1;
  uchar *puVar2;
  long in_RCX;
  long in_RDX;
  rle_count_t *in_RSI;
  RLEScanState<unsigned_char> *in_RDI;
  Vector *unaff_retaddr;
  uchar *result_data;
  
  Vector::SetVectorType(unaff_retaddr,(VectorType)((ulong)in_RDI >> 0x38));
  puVar2 = ConstantVector::GetData<unsigned_char>((Vector *)0xa22436);
  *puVar2 = *(uchar *)(in_RDX + in_RDI->entry_pos);
  in_RDI->position_in_entry = in_RCX + in_RDI->position_in_entry;
  bVar1 = RLEScanState<unsigned_char>::ExhaustedRun(in_RDI,in_RSI);
  if (bVar1) {
    RLEScanState<unsigned_char>::ForwardToNextRun(in_RDI);
  }
  return;
}

Assistant:

static void RLEScanConstant(RLEScanState<T> &scan_state, rle_count_t *index_pointer, T *data_pointer, idx_t scan_count,
                            Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<T>(result);
	result_data[0] = data_pointer[scan_state.entry_pos];
	scan_state.position_in_entry += scan_count;
	if (scan_state.ExhaustedRun(index_pointer)) {
		scan_state.ForwardToNextRun();
	}
	return;
}